

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

oonf_rfc5444_target * oonf_rfc5444_add_target(oonf_rfc5444_interface *interf,netaddr *dst)

{
  oonf_log_source source;
  avl_node *paVar1;
  char *pcVar2;
  list_entity **local_b0;
  undefined1 local_a6 [8];
  netaddr_str nbuf;
  oonf_rfc5444_target *target;
  netaddr *dst_local;
  oonf_rfc5444_interface *interf_local;
  
  paVar1 = avl_find(&interf->_target_tree,dst);
  if (paVar1 == (avl_node *)0x0) {
    local_b0 = (list_entity **)0x0;
  }
  else {
    local_b0 = &paVar1[-3].list.prev;
  }
  nbuf.buf._54_8_ = local_b0;
  if (local_b0 == (list_entity **)0x0) {
    nbuf.buf._54_8_ = _create_target(interf,dst,true);
    if ((oonf_rfc5444_target *)nbuf.buf._54_8_ == (oonf_rfc5444_target *)0x0) {
      return (oonf_rfc5444_target *)0x0;
    }
    (((oonf_rfc5444_target *)nbuf.buf._54_8_)->_node).key =
         &((oonf_rfc5444_target *)nbuf.buf._54_8_)->dst;
    avl_insert(&interf->_target_tree,&((oonf_rfc5444_target *)nbuf.buf._54_8_)->_node);
  }
  source = _oonf_rfc5444_subsystem.logging;
  if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    pcVar2 = netaddr_to_prefixstring((netaddr_str *)local_a6,dst,false);
    oonf_log(LOG_SEVERITY_INFO,source,"src/base/oonf_rfc5444.c",0x341,(void *)0x0,0,
             "Add target %s to interface %s on protocol %s (refcount was %d)",pcVar2,interf,
             interf->protocol,*(undefined4 *)(nbuf.buf._54_8_ + 0x138));
  }
  interf->_refcount = interf->_refcount + 1;
  return (oonf_rfc5444_target *)nbuf.buf._54_8_;
}

Assistant:

struct oonf_rfc5444_target *
oonf_rfc5444_add_target(struct oonf_rfc5444_interface *interf, struct netaddr *dst) {
  struct oonf_rfc5444_target *target;
#ifdef OONF_LOG_INFO
  struct netaddr_str nbuf;
#endif

  target = avl_find_element(&interf->_target_tree, dst, target, _node);
  if (!target) {
    target = _create_target(interf, dst, true);
    if (target == NULL) {
      return NULL;
    }

    /* hook into interface tree */
    target->_node.key = &target->dst;
    avl_insert(&interf->_target_tree, &target->_node);
  }

  OONF_INFO(LOG_RFC5444, "Add target %s to interface %s on protocol %s (refcount was %d)",
    netaddr_to_string(&nbuf, dst), interf->name, interf->protocol->name, target->_refcount);

  /* increase interface refcount */
  interf->_refcount++;
  return target;
}